

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O3

bool Diligent::LinuxFileSystem::FileExists(Char *strFilePath)

{
  int iVar1;
  string path;
  stat StatBuff;
  String local_d0;
  stat local_b0;
  
  std::__cxx11::string::string((string *)&local_d0,strFilePath,(allocator *)&local_b0);
  BasicFileSystem::CorrectSlashes(&local_d0,'\0');
  iVar1 = stat(local_d0._M_dataplus._M_p,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return (local_b0.st_mode & 0xf000) != 0x4000 && iVar1 == 0;
}

Assistant:

bool LinuxFileSystem::FileExists(const Char* strFilePath)
{
    std::string path{strFilePath};
    CorrectSlashes(path);

    struct stat StatBuff;
    if (stat(path.c_str(), &StatBuff) != 0)
        return false;

    return !S_ISDIR(StatBuff.st_mode);
}